

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_csv.cpp
# Opt level: O3

plus_triple * argagg::convert::arg<plus_triple>(char *s)

{
  bool bVar1;
  plus_triple *in_RDI;
  char *local_10;
  
  in_RDI->x = 0.0;
  in_RDI->y = 0.0;
  in_RDI->z = 0.0;
  bVar1 = parse_next_component<double>(&local_10,&in_RDI->x,'+');
  if (bVar1) {
    bVar1 = parse_next_component<double>(&local_10,&in_RDI->y,'+');
    if (bVar1) {
      parse_next_component<double>(&local_10,&in_RDI->z,'+');
    }
  }
  return in_RDI;
}

Assistant:

plus_triple arg(const char* s)
  {
    plus_triple result {0.0, 0.0, 0.0};
    if (!parse_next_component(s, result.x, '+')) {
      return result;
    }
    if (!parse_next_component(s, result.y, '+')) {
      return result;
    }
    if (!parse_next_component(s, result.z, '+')) {
      return result;
    }
    return result;
  }